

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doit.cpp
# Opt level: O2

void doit(gulcalcopts *opt)

{
  bool bVar1;
  code *itemWriter;
  code *lossWriter;
  _func_void_void_ptr_int_int *coverageWriter;
  code *pcVar2;
  _func_void_void_ptr_int_int *correlatedWriter;
  int stream_type;
  vector<float,_std::allocator<float>_> coverages;
  vector<damagebindictionary,_std::allocator<damagebindictionary>_> damagebindictionary_vec;
  map<item_map_key,_std::vector<item_map_rec,_std::allocator<item_map_rec>_>,_std::less<item_map_key>,_std::allocator<std::pair<const_item_map_key,_std::vector<item_map_rec,_std::allocator<item_map_rec>_>_>_>_>
  item_map;
  gulcalc g;
  getRands rnd0;
  getRands rnd;
  
  damagebindictionary_vec.
  super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  damagebindictionary_vec.
  super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  damagebindictionary_vec.
  super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  getdamagebindictionary(&damagebindictionary_vec);
  item_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &item_map._M_t._M_impl.super__Rb_tree_header._M_header;
  item_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  item_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  item_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  item_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       item_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  getitems(&item_map);
  coverages.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  coverages.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  coverages.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  getcoverages(&coverages);
  stream_type = 0;
  bVar1 = getrec((char *)&stream_type,_stdin,4);
  if (!bVar1) {
    std::operator<<((ostream *)&std::cerr,"FATAL: gulcalc: Error no stream type returned\n");
    goto LAB_00107d48;
  }
  getRands::getRands(&rnd,opt->rndopt,opt->rand_vector_size,opt->rand_seed);
  getRands::getRands(&rnd0,opt->rndopt,opt->rand_vector_size,opt->rand_seed);
  itemout = opt->itemout;
  covout = opt->covout;
  corrout = opt->corrout;
  pcVar2 = gulcalc::mode0;
  if (opt->itemLevelOutput == true) {
    if (opt->allocRule < 0) {
      itemWriter = ::itemWriter;
      goto LAB_00107ca9;
    }
    if (opt->allocRule == 0) {
      pcVar2 = gulcalc::mode0;
    }
    else {
      pcVar2 = gulcalc::mode1;
    }
    lossWriter = ::itemWriter;
    itemWriter = (_func_void_void_ptr_int_int *)0x0;
  }
  else {
    itemWriter = (_func_void_void_ptr_int_int *)0x0;
LAB_00107ca9:
    lossWriter = (_func_void_void_ptr_int_int *)0x0;
  }
  coverageWriter = ::coverageWriter;
  if (opt->coverageLevelOutput == false) {
    coverageWriter = (_func_void_void_ptr_int_int *)0x0;
  }
  correlatedWriter = ::correlatedWriter;
  if (opt->correlatedLevelOutput == false) {
    correlatedWriter = (_func_void_void_ptr_int_int *)0x0;
  }
  gulcalc::gulcalc(&g,&damagebindictionary_vec,&coverages,&item_map,&rnd,&rnd0,itemWriter,
                   coverageWriter,lossWriter,correlatedWriter,iGetrec,opt);
  (*pcVar2)(&g);
  gulcalc::~gulcalc(&g);
  getRands::~getRands(&rnd0);
  getRands::~getRands(&rnd);
LAB_00107d48:
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&coverages.super__Vector_base<float,_std::allocator<float>_>);
  std::
  _Rb_tree<item_map_key,_std::pair<const_item_map_key,_std::vector<item_map_rec,_std::allocator<item_map_rec>_>_>,_std::_Select1st<std::pair<const_item_map_key,_std::vector<item_map_rec,_std::allocator<item_map_rec>_>_>_>,_std::less<item_map_key>,_std::allocator<std::pair<const_item_map_key,_std::vector<item_map_rec,_std::allocator<item_map_rec>_>_>_>_>
  ::~_Rb_tree(&item_map._M_t);
  std::_Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>::~_Vector_base
            (&damagebindictionary_vec.
              super__Vector_base<damagebindictionary,_std::allocator<damagebindictionary>_>);
  return;
}

Assistant:

void doit(const gulcalcopts &opt)
{
	std::vector<damagebindictionary> damagebindictionary_vec;
	getdamagebindictionary(damagebindictionary_vec);

	std::map<item_map_key, std::vector<item_map_rec> > item_map;
	getitems(item_map);

	std::vector<OASIS_FLOAT> coverages;
	getcoverages(coverages);

	//size_t total_bins = damagebindictionary_vec.size();
	//int max_recsize = (int)(total_bins * sizeof(prob_mean)) + sizeof(damagecdfrec) + sizeof(int);
	//int last_event_id = -1;

	int stream_type = 0;
	bool bSuccess = getrec((char *)&stream_type, stdin, sizeof(stream_type));
	if (bSuccess == false) {
		cerr << "FATAL: gulcalc: Error no stream type returned\n";
		return; // exit thread if failed
	}

	void(*itmWriter)(const void *ibuf, int size, int count);
	void(*covWriter)(const void *ibuf, int size, int count);
    	void (*lossWriter)(const void *ibuf, int size, int count);
    	void(*corrWriter)(const void *ibuf, int size, int count);

	itmWriter = 0;
	covWriter = 0;
    	lossWriter = 0;
    	corrWriter = 0;

	getRands rnd(opt.rndopt, opt.rand_vector_size, opt.rand_seed);
	getRands rnd0(opt.rndopt, opt.rand_vector_size, opt.rand_seed);
	itemout = opt.itemout;
	covout = opt.covout;
	corrout = opt.corrout;

	void (gulcalc::*mode)();
	mode = &gulcalc::mode0;   // Classic gulcalc
	if (opt.itemLevelOutput == true) {
		if (opt.allocRule > -1) {
			lossWriter = itemWriter;   // Loss stream
			if (opt.allocRule > 0) mode = &gulcalc::mode1;   // Back allocation
		} else {
			itmWriter = itemWriter;   // Item stream
		}
	}
	if (opt.coverageLevelOutput == true) covWriter = coverageWriter;
    	if(opt.correlatedLevelOutput == true) corrWriter = correlatedWriter;
	gulcalc g(damagebindictionary_vec, coverages, item_map, rnd, rnd0, itmWriter, covWriter, lossWriter, corrWriter, iGetrec, opt);
	(g.*mode)();   // g.mode0() or g.mode1()

	return;

}